

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

bool __thiscall capnp::_::ListReader::isCanonical(ListReader *this,word **readHead,WirePointer *ref)

{
  ElementSize EVar1;
  bool bVar2;
  WordCountN<29> WVar3;
  BitsPerElementTableType BVar4;
  unsigned_long uVar5;
  uint *puVar6;
  ulong uVar7;
  WordCount64 WVar8;
  WirePointer WVar9;
  bool bVar10;
  bool bVar11;
  int mask;
  unsigned_long leftoverBits;
  word *readHeadEnd;
  uint8_t *byteReadHead;
  unsigned_long truncatedByteSize;
  unsigned_long bitSize;
  ElementCount local_104;
  Iterator local_100;
  uint ec_1;
  Iterator __end3_1;
  Iterator __begin3_1;
  Range<unsigned_int> *__range3_1;
  Fault local_d8;
  Fault f;
  undefined1 local_c8 [8];
  DebugComparison<const_capnp::word_*&,_const_capnp::word_*&> _kjCondition;
  bool local_6e;
  bool local_6d;
  ElementCount local_6c;
  bool ptrTrunc;
  Iterator IStack_68;
  bool dataTrunc;
  uint ec;
  Iterator __end3;
  Iterator __begin3;
  Range<unsigned_int> *__range3;
  bool listPtrTrunc;
  WirePointer WStack_48;
  bool listDataTrunc;
  word *pointerHead;
  word *listEnd;
  unsigned_long totalSize;
  WirePointer *pWStack_28;
  uint elementSize;
  WirePointer *ref_local;
  word **readHead_local;
  ListReader *this_local;
  
  pWStack_28 = ref;
  ref_local = (WirePointer *)readHead;
  readHead_local = (word **)this;
  EVar1 = getElementSize(this);
  if (EVar1 == POINTER) {
    if ((WirePointer)this->ptr == *ref_local) {
      *ref_local = (WirePointer)((long)*ref_local + (ulong)this->elementCount * 8);
      ___end3_1 = kj::zeroTo<unsigned_int>(this->elementCount);
      ec_1 = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end3_1);
      local_100 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end3_1);
      while (bVar11 = kj::Range<unsigned_int>::Iterator::operator==((Iterator *)&ec_1,&local_100),
            ((bVar11 ^ 0xffU) & 1) != 0) {
        puVar6 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&ec_1);
        local_104 = *puVar6;
        getPointerElement((PointerReader *)&bitSize,this,local_104);
        bVar11 = PointerReader::isCanonical((PointerReader *)&bitSize,(word **)ref_local);
        if (((bVar11 ^ 0xffU) & 1) != 0) {
          return false;
        }
        kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&ec_1);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else if (EVar1 == INLINE_COMPOSITE) {
    *ref_local = (WirePointer)((long)*ref_local + 8);
    if ((WirePointer)this->ptr == *ref_local) {
      if ((this->structDataSize & 0x3f) == 0) {
        StructSize::StructSize
                  ((StructSize *)&totalSize,(StructDataWordCount)(this->structDataSize >> 6),
                   this->structPointerCount);
        totalSize._4_4_ = StructSize::total((StructSize *)&totalSize);
        uVar5 = upgradeBound<unsigned_long,unsigned_int>(this->elementCount);
        uVar7 = (ulong)totalSize._4_4_;
        listEnd = (word *)(uVar5 * uVar7);
        WVar3 = WirePointer::ListRef::inlineCompositeWordCount(&(pWStack_28->field_1).listRef);
        if ((word *)(uVar5 * uVar7) == (word *)(ulong)WVar3) {
          if (totalSize._4_4_ == 0) {
            this_local._7_1_ = true;
          }
          else {
            WStack_48 = (WirePointer)((long)*ref_local + (long)listEnd * 8);
            bVar10 = false;
            bVar11 = false;
            pointerHead = (word *)WStack_48;
            ___end3 = kj::zeroTo<unsigned_int>(this->elementCount);
            ec = (uint)kj::Range<unsigned_int>::begin((Range<unsigned_int> *)&__end3);
            IStack_68 = kj::Range<unsigned_int>::end((Range<unsigned_int> *)&__end3);
            while (bVar2 = kj::Range<unsigned_int>::Iterator::operator==
                                     ((Iterator *)&ec,&stack0xffffffffffffff98),
                  ((bVar2 ^ 0xffU) & 1) != 0) {
              puVar6 = kj::Range<unsigned_int>::Iterator::operator*((Iterator *)&ec);
              local_6c = *puVar6;
              getStructElement((StructReader *)&_kjCondition.result,this,local_6c);
              bVar2 = StructReader::isCanonical
                                ((StructReader *)&_kjCondition.result,(word **)ref_local,
                                 (word **)&stack0xffffffffffffffb8,&local_6d,&local_6e);
              if (((bVar2 ^ 0xffU) & 1) != 0) {
                return false;
              }
              bVar10 = bVar10 || (local_6d & 1U) != 0;
              bVar11 = bVar11 != false || (local_6e & 1U) != 0;
              kj::Range<unsigned_int>::Iterator::operator++((Iterator *)&ec);
            }
            f.exception = (Exception *)
                          kj::_::DebugExpressionStart::operator<<
                                    ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(word **)ref_local
                                    );
            kj::_::DebugExpression<capnp::word_const*&>::operator==
                      ((DebugComparison<const_capnp::word_*&,_const_capnp::word_*&> *)local_c8,
                       (DebugExpression<capnp::word_const*&> *)&f,&pointerHead);
            bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c8);
            if (!bVar2) {
              kj::_::Debug::Fault::
              Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::word_const*&,capnp::word_const*&>&,capnp::word_const*&,capnp::word_const*&>
                        (&local_d8,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                         ,0xcd6,FAILED,"*readHead == listEnd","_kjCondition,*readHead, listEnd",
                         (DebugComparison<const_capnp::word_*&,_const_capnp::word_*&> *)local_c8,
                         (word **)ref_local,&pointerHead);
              kj::_::Debug::Fault::fatal(&local_d8);
            }
            *ref_local = WStack_48;
            this_local._7_1_ = false;
            if (bVar10) {
              this_local._7_1_ = bVar11;
            }
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else if ((WirePointer)this->ptr == *ref_local) {
    uVar5 = upgradeBound<unsigned_long,unsigned_int>(this->elementCount);
    BVar4 = dataBitsPerElement(this->elementSize);
    uVar7 = uVar5 * BVar4;
    readHeadEnd = (word *)((long)*ref_local + (uVar7 >> 3));
    WVar9 = *ref_local;
    WVar8 = WireHelpers::roundBitsUpToWords(uVar7);
    WVar9 = (WirePointer)((long)WVar9 + WVar8 * 8);
    if ((uVar7 & 7) != 0) {
      uVar5 = unbound<unsigned_long>(uVar7 & 7);
      if ((((1 << ((byte)uVar5 & 0x1f)) - 1U ^ 0xffffffff) & (uint)(byte)readHeadEnd->content) != 0)
      {
        return false;
      }
      readHeadEnd = (word *)((long)&readHeadEnd->content + 1);
    }
    for (; (WirePointer)readHeadEnd != WVar9;
        readHeadEnd = (word *)((long)&readHeadEnd->content + 1)) {
      if ((char)readHeadEnd->content != '\0') {
        return false;
      }
    }
    *ref_local = WVar9;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ListReader::isCanonical(const word **readHead, const WirePointer *ref) {
  switch (this->getElementSize()) {
    case ElementSize::INLINE_COMPOSITE: {
      *readHead += 1;
      if (reinterpret_cast<const word*>(this->ptr) != *readHead) {
        // The next word to read is the tag word, but the pointer is in
        // front of it, so our check is slightly different
        return false;
      }
      if (this->structDataSize % BITS_PER_WORD != ZERO * BITS) {
        return false;
      }
      auto elementSize = StructSize(this->structDataSize / BITS_PER_WORD,
                                    this->structPointerCount).total() / ELEMENTS;
      auto totalSize = upgradeBound<uint64_t>(this->elementCount) * elementSize;
      if (totalSize != ref->listRef.inlineCompositeWordCount()) {
        return false;
      }
      if (elementSize == ZERO * WORDS / ELEMENTS) {
        return true;
      }
      auto listEnd = *readHead + totalSize;
      auto pointerHead = listEnd;
      bool listDataTrunc = false;
      bool listPtrTrunc = false;
      for (auto ec: kj::zeroTo(this->elementCount)) {
        bool dataTrunc, ptrTrunc;
        if (!this->getStructElement(ec).isCanonical(readHead,
                                                    &pointerHead,
                                                    &dataTrunc,
                                                    &ptrTrunc)) {
          return false;
        }
        listDataTrunc |= dataTrunc;
        listPtrTrunc  |= ptrTrunc;
      }
      KJ_REQUIRE(*readHead == listEnd, *readHead, listEnd);
      *readHead = pointerHead;
      return listDataTrunc && listPtrTrunc;
    }
    case ElementSize::POINTER: {
      if (reinterpret_cast<const word*>(this->ptr) != *readHead) {
        return false;
      }
      *readHead += this->elementCount * (POINTERS / ELEMENTS) * WORDS_PER_POINTER;
      for (auto ec: kj::zeroTo(this->elementCount)) {
        if (!this->getPointerElement(ec).isCanonical(readHead)) {
          return false;
        }
      }
      return true;
    }
    default: {
      if (reinterpret_cast<const word*>(this->ptr) != *readHead) {
        return false;
      }

      auto bitSize = upgradeBound<uint64_t>(this->elementCount) *
                     dataBitsPerElement(this->elementSize);
      auto truncatedByteSize = bitSize / BITS_PER_BYTE;
      auto byteReadHead = reinterpret_cast<const uint8_t*>(*readHead) + truncatedByteSize;
      auto readHeadEnd = *readHead + WireHelpers::roundBitsUpToWords(bitSize);

      auto leftoverBits = bitSize % BITS_PER_BYTE;
      if (leftoverBits > ZERO * BITS) {
        auto mask = ~((1 << unbound(leftoverBits / BITS)) - 1);

        if (mask & *byteReadHead) {
          return false;
        }
        byteReadHead += 1;
      }

      while (byteReadHead != reinterpret_cast<const uint8_t*>(readHeadEnd)) {
        if (*byteReadHead != 0) {
          return false;
        }
        byteReadHead += 1;
      }

      *readHead = readHeadEnd;
      return true;
    }
  }
  KJ_UNREACHABLE;
}